

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::convertGlslangToSpvType
          (TGlslangToSpvTraverser *this,TType *type,bool forwardReferenceOnly)

{
  TLayoutPacking explicitLayout;
  int iVar1;
  Id IVar2;
  undefined4 extraout_var;
  bool forwardReferenceOnly_local;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  explicitLayout = getExplicitLayout(this,type);
  iVar1 = (*type->_vptr_TType[0xb])();
  IVar2 = convertGlslangToSpvType
                    (this,type,explicitLayout,(TQualifier *)CONCAT44(extraout_var,iVar1),false,
                     forwardReferenceOnly);
  return IVar2;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType& type, bool forwardReferenceOnly)
{
    return convertGlslangToSpvType(type, getExplicitLayout(type), type.getQualifier(), false, forwardReferenceOnly);
}